

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DWARFUnit.cpp
# Opt level: O0

DWARFDie __thiscall llvm::DWARFUnit::getSubroutineForAddress(DWARFUnit *this,uint64_t Address)

{
  DWARFDie DVar1;
  uint64_t uVar2;
  bool bVar3;
  pointer ppVar4;
  _Self local_48;
  _Self local_40;
  iterator R;
  uint64_t local_28;
  uint64_t Address_local;
  DWARFUnit *this_local;
  DWARFDebugInfoEntry *local_10;
  
  local_28 = Address;
  Address_local = (uint64_t)this;
  extractDIEsIfNeeded(this,false);
  bVar3 = std::
          map<unsigned_long,_std::pair<unsigned_long,_llvm::DWARFDie>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::pair<unsigned_long,_llvm::DWARFDie>_>_>_>
          ::empty(&this->AddrDieMap);
  if (bVar3) {
    _R = getUnitDIE(this,true);
    updateAddressDieMap(this,_R);
  }
  local_40._M_node =
       (_Base_ptr)
       std::
       map<unsigned_long,_std::pair<unsigned_long,_llvm::DWARFDie>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::pair<unsigned_long,_llvm::DWARFDie>_>_>_>
       ::upper_bound(&this->AddrDieMap,&local_28);
  local_48._M_node =
       (_Base_ptr)
       std::
       map<unsigned_long,_std::pair<unsigned_long,_llvm::DWARFDie>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::pair<unsigned_long,_llvm::DWARFDie>_>_>_>
       ::begin(&this->AddrDieMap);
  bVar3 = std::operator==(&local_40,&local_48);
  if (bVar3) {
    memset(&this_local,0,0x10);
    DWARFDie::DWARFDie((DWARFDie *)&this_local);
  }
  else {
    std::
    _Rb_tree_iterator<std::pair<const_unsigned_long,_std::pair<unsigned_long,_llvm::DWARFDie>_>_>::
    operator--(&local_40);
    uVar2 = local_28;
    ppVar4 = std::
             _Rb_tree_iterator<std::pair<const_unsigned_long,_std::pair<unsigned_long,_llvm::DWARFDie>_>_>
             ::operator->(&local_40);
    if (uVar2 < (ppVar4->second).first) {
      ppVar4 = std::
               _Rb_tree_iterator<std::pair<const_unsigned_long,_std::pair<unsigned_long,_llvm::DWARFDie>_>_>
               ::operator->(&local_40);
      this_local = (ppVar4->second).second.U;
      local_10 = (ppVar4->second).second.Die;
    }
    else {
      memset(&this_local,0,0x10);
      DWARFDie::DWARFDie((DWARFDie *)&this_local);
    }
  }
  DVar1.Die = local_10;
  DVar1.U = this_local;
  return DVar1;
}

Assistant:

DWARFDie DWARFUnit::getSubroutineForAddress(uint64_t Address) {
  extractDIEsIfNeeded(false);
  if (AddrDieMap.empty())
    updateAddressDieMap(getUnitDIE());
  auto R = AddrDieMap.upper_bound(Address);
  if (R == AddrDieMap.begin())
    return DWARFDie();
  // upper_bound's previous item contains Address.
  --R;
  if (Address >= R->second.first)
    return DWARFDie();
  return R->second.second;
}